

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

void __thiscall Js::AsmJsModuleCompiler::RevertFunction(AsmJsModuleCompiler *this,int funcIndex)

{
  AsmJsFunc *this_00;
  Type *ppAVar1;
  FunctionBody *pFVar2;
  ProxyEntryPointInfo *entryPoint;
  ScriptContext *pSVar3;
  ParseNodeFnc *pPVar4;
  FunctionBody *funcBody;
  AsmJsFunc *func;
  int funcIndex_local;
  AsmJsModuleCompiler *this_local;
  
  ppAVar1 = JsUtil::
            List<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(&this->mFunctionArray,funcIndex);
  this_00 = *ppAVar1;
  pFVar2 = AsmJsFunc::GetFuncBody(this_00);
  FunctionBody::ResetByteCodeGenState(pFVar2);
  FunctionBody::AddDeferParseAttribute(pFVar2);
  ParseableFunctionInfo::SetFunctionParsed(&pFVar2->super_ParseableFunctionInfo,false);
  FunctionBody::ResetEntryPoint(pFVar2);
  entryPoint = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)pFVar2);
  pSVar3 = GetScriptContext(this);
  ParseableFunctionInfo::SetEntryPoint
            (&pFVar2->super_ParseableFunctionInfo,entryPoint,pSVar3->DeferredParsingThunk);
  ParseableFunctionInfo::SetIsAsmjsMode(&pFVar2->super_ParseableFunctionInfo,false);
  FunctionBody::SetIsAsmJsFunction(pFVar2,false);
  pFVar2 = AsmJsFunc::GetFuncBody(this_00);
  pPVar4 = AsmJsFunc::GetFncNode(this_00);
  pPVar4->funcInfo->byteCodeFunction = &pFVar2->super_ParseableFunctionInfo;
  return;
}

Assistant:

void AsmJsModuleCompiler::RevertFunction(int funcIndex)
    {
        AsmJsFunc* func = mFunctionArray.Item(funcIndex);
        FunctionBody * funcBody = func->GetFuncBody();
        funcBody->ResetByteCodeGenState();
        funcBody->AddDeferParseAttribute();
        funcBody->SetFunctionParsed(false);
        funcBody->ResetEntryPoint();
        funcBody->SetEntryPoint(funcBody->GetDefaultEntryPointInfo(), GetScriptContext()->DeferredParsingThunk);
        funcBody->SetIsAsmjsMode(false);
        funcBody->SetIsAsmJsFunction(false);
        func->GetFncNode()->funcInfo->byteCodeFunction = func->GetFuncBody();
    }